

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3.h
# Opt level: O0

void ncnn::conv3x3s1_winograd23_transform_kernel_sse
               (Mat *kernel,Mat *kernel_tm2,int inch,int outch,Option *opt)

{
  int in_ECX;
  long lVar1;
  int in_EDX;
  long *in_RSI;
  long *in_RDI;
  float *k00_2;
  int p_3;
  float *g00_2;
  int k_2;
  Mat g0_2;
  float *k00_1;
  int i_3;
  int p_2;
  float *g00_1;
  int k_1;
  Mat g0_1;
  float *k00;
  int i_2;
  int p_1;
  float *g00;
  int k;
  Mat g0;
  int q;
  int i_1;
  float *tmpp;
  int j;
  int i;
  float tmp [4] [3];
  float *k2;
  float *k1;
  float *k0;
  float *kernel_tm0;
  float *kernel0;
  int q_1;
  int p;
  float ktm [4] [3];
  Mat kernel_tm;
  Mat *m_6;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_fffffffffffff5c0;
  size_t in_stack_fffffffffffff5c8;
  undefined8 in_stack_fffffffffffff5d0;
  int _c;
  undefined8 in_stack_fffffffffffff5d8;
  Mat *in_stack_fffffffffffff5e0;
  undefined8 local_920;
  undefined8 local_918;
  undefined8 local_910;
  undefined4 local_908;
  long *local_900;
  undefined4 local_8f8;
  undefined4 local_8f4;
  undefined4 local_8f0;
  undefined4 local_8ec;
  undefined4 local_8e8;
  undefined8 local_8e0;
  void *local_8d8;
  int local_8cc;
  undefined4 *local_8c8;
  int local_8bc;
  undefined8 local_8b8;
  undefined8 local_8b0;
  undefined8 local_8a8;
  undefined4 local_8a0;
  long local_898;
  undefined4 local_890;
  undefined4 local_88c;
  undefined4 local_888;
  undefined4 local_884;
  undefined4 local_880;
  undefined8 local_878;
  undefined8 local_870;
  undefined8 local_868;
  undefined8 local_860;
  undefined4 local_858;
  long *local_850;
  undefined4 local_848;
  undefined4 local_844;
  undefined4 local_840;
  undefined4 local_83c;
  undefined4 local_838;
  undefined8 local_830;
  void *local_828;
  int local_820;
  int local_81c;
  undefined4 *local_818;
  int local_80c;
  undefined8 local_808;
  undefined8 local_800;
  undefined8 local_7f8;
  undefined4 local_7f0;
  long local_7e8;
  undefined4 local_7e0;
  undefined4 local_7dc;
  undefined4 local_7d8;
  undefined4 local_7d4;
  undefined4 local_7d0;
  undefined8 local_7c8;
  undefined8 local_7c0;
  undefined8 local_7b8;
  undefined8 local_7b0;
  undefined4 local_7a8;
  long *local_7a0;
  undefined4 local_798;
  undefined4 local_794;
  undefined4 local_790;
  undefined4 local_78c;
  undefined4 local_788;
  undefined8 local_780;
  void *local_778;
  int local_770;
  int local_76c;
  undefined4 *local_768;
  int local_75c;
  undefined8 local_758;
  undefined8 local_750;
  undefined8 local_748;
  undefined4 local_740;
  long local_738;
  undefined4 local_730;
  undefined4 local_72c;
  undefined4 local_728;
  undefined4 local_724;
  undefined4 local_720;
  undefined8 local_718;
  int local_710;
  int local_70c;
  float *local_708;
  int local_700;
  int local_6fc;
  float local_6f8 [14];
  float *local_6c0;
  float *local_6b8;
  float *local_6b0;
  undefined8 local_6a8;
  undefined8 local_6a0;
  undefined8 local_698;
  undefined4 local_690;
  long *local_688;
  int local_680;
  undefined4 local_67c;
  undefined4 local_678;
  undefined4 local_674;
  undefined4 local_670;
  long local_668;
  void *local_660;
  float *local_648;
  int local_640;
  int local_63c;
  float local_638 [12];
  void *local_608;
  int *local_600;
  long local_5f8;
  undefined4 local_5f0;
  long *local_5e8;
  int local_5e0;
  int local_5dc;
  int local_5d8;
  undefined4 local_5d4;
  undefined4 local_5d0;
  long local_5c8;
  int local_5b8;
  int local_5b4;
  long *local_5b0;
  long *local_5a8;
  undefined8 *local_5a0;
  undefined8 *local_598;
  undefined8 *local_590;
  undefined8 *local_580;
  undefined8 *local_578;
  undefined8 *local_568;
  undefined8 *local_560;
  void **local_550;
  int local_530;
  undefined4 local_52c;
  void **local_528;
  undefined8 *local_508;
  undefined8 *local_4f8;
  undefined8 *local_4d8;
  undefined8 *local_4c8;
  undefined8 *local_4a8;
  undefined8 *local_498;
  undefined8 *local_488;
  undefined1 local_47d;
  int local_47c;
  void **local_478;
  undefined8 *local_470;
  undefined1 local_44d;
  int local_44c;
  undefined8 *local_440;
  undefined1 local_41d;
  int local_41c;
  void **local_418;
  undefined8 *local_410;
  undefined1 local_3ed;
  int local_3ec;
  undefined8 *local_3e0;
  undefined1 local_3bd;
  int local_3bc;
  void **local_3b8;
  undefined8 *local_3b0;
  undefined1 local_38d;
  int local_38c;
  undefined8 *local_380;
  undefined1 local_35d;
  int local_35c;
  void **local_358;
  undefined8 *local_350;
  long *local_330;
  void *local_2a0;
  int local_28c;
  undefined8 *local_288;
  int local_27c;
  undefined8 *local_278;
  int local_26c;
  undefined8 *local_268;
  int local_25c;
  undefined8 *local_258;
  int local_24c;
  undefined8 *local_248;
  int local_23c;
  undefined8 *local_238;
  int local_22c;
  undefined8 *local_228;
  undefined8 local_220;
  undefined8 local_218;
  undefined4 local_204;
  void **local_200;
  long *local_1f8;
  undefined4 local_1ec;
  long local_1e8;
  void *local_1e0;
  undefined4 local_1d4;
  int local_1d0;
  int local_1cc;
  undefined8 *local_1c8;
  long local_1c0;
  undefined4 local_1b4;
  long local_1b0;
  long local_1a8;
  undefined4 local_19c;
  int local_198;
  int local_194;
  undefined8 *local_190;
  long *local_188;
  undefined4 local_17c;
  long local_178;
  void *local_170;
  undefined4 local_164;
  int local_160;
  int local_15c;
  undefined8 *local_158;
  long local_150;
  undefined4 local_144;
  long local_140;
  long local_138;
  undefined4 local_12c;
  int local_128;
  int local_124;
  undefined8 *local_120;
  long *local_118;
  undefined4 local_10c;
  long local_108;
  void *local_100;
  undefined4 local_f4;
  int local_f0;
  int local_ec;
  undefined8 *local_e8;
  long local_e0;
  undefined4 local_d4;
  long local_d0;
  long local_c8;
  undefined4 local_bc;
  int local_b8;
  int local_b4;
  undefined8 *local_b0;
  long *local_a8;
  undefined4 local_9c;
  long local_98;
  void *local_90;
  undefined4 local_84;
  int local_80;
  int local_7c;
  undefined8 *local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  _c = (int)((ulong)in_stack_fffffffffffff5d0 >> 0x20);
  local_200 = &local_608;
  local_204 = 0x10;
  local_218 = 4;
  local_220 = 0;
  local_608 = (void *)0x0;
  local_600 = (int *)0x0;
  local_5f8 = 0;
  local_5f0 = 0;
  local_5e8 = (long *)0x0;
  local_5e0 = 0;
  local_5dc = 0;
  local_5d8 = 0;
  local_5d4 = 0;
  local_5d0 = 0;
  local_5c8 = 0;
  local_5b8 = in_ECX;
  local_5b4 = in_EDX;
  local_5b0 = in_RSI;
  local_5a8 = in_RDI;
  Mat::create(in_stack_fffffffffffff5e0,(int)((ulong)in_stack_fffffffffffff5d8 >> 0x20),
              (int)in_stack_fffffffffffff5d8,_c,in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0)
  ;
  memcpy(local_638,&DAT_01f07290,0x30);
  for (local_63c = 0; local_63c < local_5b8; local_63c = local_63c + 1) {
    for (local_640 = 0; local_640 < local_5b4; local_640 = local_640 + 1) {
      local_330 = local_5a8;
      local_648 = (float *)(*local_5a8 + (long)(local_63c * local_5b4 * 9) * 4 +
                           (long)(local_640 * 9) * 4);
      local_350 = &local_6a8;
      local_358 = &local_608;
      local_35c = local_63c;
      local_1e0 = (void *)((long)local_608 + local_5c8 * local_63c * local_5f8);
      local_1c8 = &local_6a8;
      local_1cc = local_5dc;
      local_1d0 = local_5d8;
      local_1d4 = local_5d4;
      local_1e8 = local_5f8;
      local_1ec = local_5f0;
      local_1f8 = local_5e8;
      local_688 = local_5e8;
      local_8 = (long)local_5dc * (long)local_5d8 * local_5f8;
      local_c = 0x10;
      local_680 = local_5e0 + -1;
      if (local_5e0 == 4) {
        local_668 = (long)local_5dc * (long)local_5d8;
      }
      local_35d = 1;
      local_228 = &local_6a8;
      local_22c = local_640;
      local_5a0 = &local_6a8;
      local_488 = local_5a0;
      local_c = 0x10;
      local_35d = 1;
      local_6a8 = 0;
      local_698 = 0;
      local_690 = 0;
      local_680 = 0;
      local_67c = 0;
      local_678 = 0;
      local_674 = 0;
      local_670 = 0;
      local_668 = 0;
      local_6a0 = 0;
      local_660 = (void *)((long)local_1e0 + (long)local_5dc * (long)local_640 * local_5f8);
      local_6b0 = local_648;
      local_6b8 = local_648 + 3;
      local_6c0 = local_648 + 6;
      for (local_6fc = 0; local_6fc < 4; local_6fc = local_6fc + 1) {
        local_6f8[(long)local_6fc * 3] =
             *local_6b0 * local_638[(long)local_6fc * 3] +
             local_6b0[1] * local_638[(long)local_6fc * 3 + 1] +
             local_6b0[2] * local_638[(long)local_6fc * 3 + 2];
        local_6f8[(long)local_6fc * 3 + 1] =
             *local_6b8 * local_638[(long)local_6fc * 3] +
             local_6b8[1] * local_638[(long)local_6fc * 3 + 1] +
             local_6b8[2] * local_638[(long)local_6fc * 3 + 2];
        local_6f8[(long)local_6fc * 3 + 2] =
             *local_6c0 * local_638[(long)local_6fc * 3] +
             local_6c0[1] * local_638[(long)local_6fc * 3 + 1] +
             local_6c0[2] * local_638[(long)local_6fc * 3 + 2];
      }
      for (local_700 = 0; local_700 < 4; local_700 = local_700 + 1) {
        lVar1 = (long)local_700;
        local_708 = local_6f8 + lVar1 * 3;
        for (local_70c = 0; local_70c < 4; local_70c = local_70c + 1) {
          *(float *)((long)local_660 + (long)(local_700 * 4 + local_70c) * 4) =
               *local_708 * local_638[(long)local_70c * 3] +
               local_6f8[lVar1 * 3 + 1] * local_638[(long)local_70c * 3 + 1] +
               local_6f8[lVar1 * 3 + 2] * local_638[(long)local_70c * 3 + 2];
        }
      }
    }
  }
  Mat::create(in_stack_fffffffffffff5e0,(int)((ulong)in_stack_fffffffffffff5d8 >> 0x20),
              (int)in_stack_fffffffffffff5d8,_c,in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0)
  ;
  for (local_710 = 0; local_710 + 7 < local_5b8; local_710 = local_710 + 8) {
    local_38c = local_710 / 8;
    local_380 = &local_758;
    local_194 = *(int *)((long)local_5b0 + 0x2c);
    local_198 = (int)local_5b0[6];
    local_19c = *(undefined4 *)((long)local_5b0 + 0x34);
    local_1a8 = *local_5b0 + local_5b0[8] * (long)local_38c * local_5b0[2];
    local_1b0 = local_5b0[2];
    local_1b4 = (undefined4)local_5b0[3];
    local_1c0 = local_5b0[4];
    local_190 = &local_758;
    local_18 = (long)local_194 * (long)local_198 * local_1b0;
    local_1c = 0x10;
    local_38d = 1;
    for (local_75c = 0; local_75c < 0x10; local_75c = local_75c + 1) {
      local_238 = &local_758;
      local_23c = local_75c;
      local_768 = (undefined4 *)(local_1a8 + (long)local_194 * (long)local_75c * local_1b0);
      for (local_76c = 0; local_76c < local_5b4; local_76c = local_76c + 1) {
        for (local_770 = 0; local_770 < 8; local_770 = local_770 + 1) {
          local_3bc = local_710 + local_770;
          local_3b0 = &local_7c0;
          local_3b8 = &local_608;
          local_170 = (void *)((long)local_608 + local_5c8 * local_3bc * local_5f8);
          local_158 = &local_7c0;
          local_7a0 = local_5e8;
          local_28 = (long)local_5dc * (long)local_5d8 * local_5f8;
          local_2c = 0x10;
          local_15c = local_5dc;
          local_160 = local_5d8;
          local_164 = local_5d4;
          local_178 = local_5f8;
          local_17c = local_5f0;
          local_188 = local_5e8;
          local_3bd = 1;
          local_248 = &local_7c0;
          local_24c = local_76c;
          local_778 = (void *)((long)local_170 + (long)local_5dc * (long)local_76c * local_5f8);
          local_598 = &local_7c0;
          local_7c0 = 0;
          local_7b0 = 0;
          local_7a8 = 0;
          local_798 = 0;
          local_794 = 0;
          local_790 = 0;
          local_78c = 0;
          local_788 = 0;
          local_780 = 0;
          local_7b8 = 0;
          *local_768 = *(undefined4 *)((long)local_778 + (long)local_75c * 4);
          local_768 = local_768 + 1;
          local_498 = local_598;
        }
      }
    }
    local_590 = &local_758;
    local_758 = 0;
    local_748 = 0;
    local_740 = 0;
    local_730 = 0;
    local_72c = 0;
    local_728 = 0;
    local_724 = 0;
    local_720 = 0;
    local_718 = 0;
    local_750 = 0;
    local_4a8 = local_590;
    local_738 = local_1c0;
  }
  for (; local_710 + 3 < local_5b8; local_710 = local_710 + 4) {
    local_3ec = local_710 / 8 +
                (int)((long)((ulong)(uint)((int)((long)local_710 % 8) >> 0x1f) << 0x20 |
                            (long)local_710 % 8 & 0xffffffffU) / 4);
    local_3e0 = &local_808;
    local_124 = *(int *)((long)local_5b0 + 0x2c);
    local_128 = (int)local_5b0[6];
    local_12c = *(undefined4 *)((long)local_5b0 + 0x34);
    local_138 = *local_5b0 + local_5b0[8] * (long)local_3ec * local_5b0[2];
    local_140 = local_5b0[2];
    local_144 = (undefined4)local_5b0[3];
    local_150 = local_5b0[4];
    local_120 = &local_808;
    local_38 = (long)local_124 * (long)local_128 * local_140;
    local_3c = 0x10;
    local_3ed = 1;
    for (local_80c = 0; local_80c < 0x10; local_80c = local_80c + 1) {
      local_258 = &local_808;
      local_25c = local_80c;
      local_818 = (undefined4 *)(local_138 + (long)local_124 * (long)local_80c * local_140);
      for (local_81c = 0; local_81c < local_5b4; local_81c = local_81c + 1) {
        for (local_820 = 0; local_820 < 4; local_820 = local_820 + 1) {
          local_41c = local_710 + local_820;
          local_410 = &local_870;
          local_418 = &local_608;
          local_100 = (void *)((long)local_608 + local_5c8 * local_41c * local_5f8);
          local_e8 = &local_870;
          local_850 = local_5e8;
          local_48 = (long)local_5dc * (long)local_5d8 * local_5f8;
          local_4c = 0x10;
          local_ec = local_5dc;
          local_f0 = local_5d8;
          local_f4 = local_5d4;
          local_108 = local_5f8;
          local_10c = local_5f0;
          local_118 = local_5e8;
          local_41d = 1;
          local_268 = &local_870;
          local_26c = local_81c;
          local_828 = (void *)((long)local_100 + (long)local_5dc * (long)local_81c * local_5f8);
          local_580 = &local_870;
          local_870 = 0;
          local_860 = 0;
          local_858 = 0;
          local_848 = 0;
          local_844 = 0;
          local_840 = 0;
          local_83c = 0;
          local_838 = 0;
          local_830 = 0;
          local_868 = 0;
          *local_818 = *(undefined4 *)((long)local_828 + (long)local_80c * 4);
          local_818 = local_818 + 1;
          local_4c8 = local_580;
        }
      }
    }
    local_578 = &local_808;
    local_808 = 0;
    local_7f8 = 0;
    local_7f0 = 0;
    local_7e0 = 0;
    local_7dc = 0;
    local_7d8 = 0;
    local_7d4 = 0;
    local_7d0 = 0;
    local_7c8 = 0;
    local_800 = 0;
    local_4d8 = local_578;
    local_7e8 = local_150;
  }
  for (; local_710 < local_5b8; local_710 = local_710 + 1) {
    local_44c = local_710 / 8 +
                (int)((long)((ulong)(uint)((int)((long)local_710 % 8) >> 0x1f) << 0x20 |
                            (long)local_710 % 8 & 0xffffffffU) / 4) + local_710 % 4;
    local_440 = &local_8b8;
    local_b4 = *(int *)((long)local_5b0 + 0x2c);
    local_b8 = (int)local_5b0[6];
    local_bc = *(undefined4 *)((long)local_5b0 + 0x34);
    local_c8 = *local_5b0 + local_5b0[8] * (long)local_44c * local_5b0[2];
    local_d0 = local_5b0[2];
    local_d4 = (undefined4)local_5b0[3];
    local_e0 = local_5b0[4];
    local_b0 = &local_8b8;
    local_58 = (long)local_b4 * (long)local_b8 * local_d0;
    local_5c = 0x10;
    local_44d = 1;
    for (local_8bc = 0; local_8bc < 0x10; local_8bc = local_8bc + 1) {
      local_278 = &local_8b8;
      local_27c = local_8bc;
      local_8c8 = (undefined4 *)(local_c8 + (long)local_b4 * (long)local_8bc * local_d0);
      for (local_8cc = 0; local_8cc < local_5b4; local_8cc = local_8cc + 1) {
        local_470 = &local_920;
        local_478 = &local_608;
        local_90 = (void *)((long)local_608 + local_5c8 * local_710 * local_5f8);
        local_78 = &local_920;
        local_68 = (long)local_5dc * (long)local_5d8 * local_5f8;
        local_288 = &local_920;
        local_8d8 = (void *)((long)local_90 + (long)local_5dc * (long)local_8cc * local_5f8);
        local_568 = &local_920;
        local_900 = local_5e8;
        local_6c = 0x10;
        local_7c = local_5dc;
        local_80 = local_5d8;
        local_84 = local_5d4;
        local_98 = local_5f8;
        local_9c = local_5f0;
        local_a8 = local_5e8;
        local_28c = local_8cc;
        local_47c = local_710;
        local_47d = 1;
        local_920 = 0;
        local_910 = 0;
        local_908 = 0;
        local_8f8 = 0;
        local_8f4 = 0;
        local_8f0 = 0;
        local_8ec = 0;
        local_8e8 = 0;
        local_8e0 = 0;
        local_918 = 0;
        *local_8c8 = *(undefined4 *)((long)local_8d8 + (long)local_8bc * 4);
        local_8c8 = local_8c8 + 1;
        local_4f8 = local_568;
      }
    }
    local_560 = &local_8b8;
    local_8b8 = 0;
    local_8a8 = 0;
    local_8a0 = 0;
    local_890 = 0;
    local_88c = 0;
    local_888 = 0;
    local_884 = 0;
    local_880 = 0;
    local_878 = 0;
    local_8b0 = 0;
    local_508 = local_560;
    local_898 = local_e0;
  }
  local_550 = &local_608;
  if (local_600 != (int *)0x0) {
    local_52c = 0xffffffff;
    LOCK();
    local_530 = *local_600;
    *local_600 = *local_600 + -1;
    UNLOCK();
    if (local_530 == 1) {
      local_528 = local_550;
      if (local_5e8 == (long *)0x0) {
        local_2a0 = local_608;
        if (local_608 != (void *)0x0) {
          free(local_608);
        }
      }
      else {
        (**(code **)(*local_5e8 + 0x18))(local_5e8,local_608);
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_transform_kernel_sse(const Mat& kernel, Mat& kernel_tm2, int inch, int outch, const Option& opt)
{
    Mat kernel_tm(4 * 4, inch, outch);

    // G
    const float ktm[4][3] = {
        {1.0f, 0.0f, 0.0f},
        {1.0f / 2, 1.0f / 2, 1.0f / 2},
        {1.0f / 2, -1.0f / 2, 1.0f / 2},
        {0.0f, 0.0f, 1.0f}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const float* kernel0 = (const float*)kernel + p * inch * 9 + q * 9;
            float* kernel_tm0 = kernel_tm.channel(p).row(q);

            // transform kernel
            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            // h
            float tmp[4][3];
            for (int i = 0; i < 4; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j = 0; j < 4; j++)
            {
                float* tmpp = &tmp[j][0];

                for (int i = 0; i < 4; i++)
                {
                    kernel_tm0[j * 4 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }

    // interleave
    // src = 16-inch-outch
    // dst = inch-16-outch
#if __SSE2__
    kernel_tm2.create(8 * inch, 16, outch / 8 + (outch % 8) / 4 + outch % 4);
#else
    kernel_tm2.create(inch, 16, outch);
#endif

    int q = 0;
#if __SSE2__
    for (; q + 7 < outch; q += 8)
    {
        Mat g0 = kernel_tm2.channel(q / 8);

        for (int k = 0; k < 16; k++)
        {
            float* g00 = g0.row(k);

            for (int p = 0; p < inch; p++)
            {
                for (int i = 0; i < 8; i++)
                {
                    const float* k00 = kernel_tm.channel(q + i).row(p);
                    g00[0] = k00[k];
                    g00++;
                }
            }
        }
    }
    for (; q + 3 < outch; q += 4)
    {
        Mat g0 = kernel_tm2.channel(q / 8 + (q % 8) / 4);

        for (int k = 0; k < 16; k++)
        {
            float* g00 = g0.row(k);

            for (int p = 0; p < inch; p++)
            {
                for (int i = 0; i < 4; i++)
                {
                    const float* k00 = kernel_tm.channel(q + i).row(p);
                    g00[0] = k00[k];
                    g00++;
                }
            }
        }
    }
#endif
    for (; q < outch; q++)
    {
#if __SSE2__
        Mat g0 = kernel_tm2.channel(q / 8 + (q % 8) / 4 + q % 4);
#else
        Mat g0 = kernel_tm2.channel(q);
#endif

        for (int k = 0; k < 16; k++)
        {
            float* g00 = g0.row(k);

            for (int p = 0; p < inch; p++)
            {
                const float* k00 = kernel_tm.channel(q).row(p);
                g00[0] = k00[k];
                g00++;
            }
        }
    }
}